

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::RepeatedPrimitive::
GenerateSerializeWithCachedSizesToArray(RepeatedPrimitive *this,Printer *p)

{
  Printer *pPVar1;
  bool bVar2;
  undefined8 uVar3;
  char *pcVar4;
  optional<unsigned_long> oVar5;
  anon_class_1_0_00000001 local_109;
  Printer *local_108;
  long *local_100;
  undefined8 local_f8;
  undefined1 local_f0;
  undefined7 uStack_ef;
  undefined8 uStack_e8;
  long *local_e0;
  undefined8 local_d8;
  long local_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [24];
  code *local_a8;
  byte local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined1 local_78;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_70;
  
  local_108 = p;
  bVar2 = FieldDescriptor::is_packed((this->super_FieldGeneratorBase).field_);
  if (bVar2) {
    oVar5 = FixedSize((uint)((this->super_FieldGeneratorBase).field_)->type_);
    pPVar1 = local_108;
    if (((undefined1  [16])
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
        (undefined1  [16])0x0) {
      local_100 = (long *)&local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"byte_size","");
      if (local_100 == (long *)&local_f0) {
        uStack_c8 = uStack_e8;
        local_e0 = &local_d0;
      }
      else {
        local_e0 = local_100;
      }
      local_d0 = CONCAT71(uStack_ef,local_f0);
      local_d8 = local_f8;
      local_f8 = 0;
      local_f0 = 0;
      local_100 = (long *)&local_f0;
      local_c0._0_8_ = operator_new(0x18);
      *(RepeatedPrimitive **)local_c0._0_8_ = this;
      *(Printer ***)(local_c0._0_8_ + 8) = &local_108;
      *(undefined1 *)(local_c0._0_8_ + 0x10) = 0;
      local_a8 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
      local_c0._8_8_ = 0;
      local_c0._16_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_a0 = 1;
      local_90 = 0;
      local_88 = 0;
      local_78 = 0;
      local_98 = &local_88;
      std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)0x0,0x53a374);
      local_70._M_engaged = false;
      io::Printer::Emit(pPVar1,&local_e0,1,0xed,
                        "\n        {\n          int byte_size = $byte_size$;\n          if (byte_size > 0) {\n            target = stream->Write$DeclaredType$Packed(\n                $number$, this_._internal_$name$(), byte_size, target);\n          }\n        }\n      "
                       );
      if (local_70._M_engaged == true) {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  (&local_70);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[local_a0]._M_data)
                (&local_109,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)local_c0);
      local_a0 = 0xff;
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      if (local_100 != (long *)&local_f0) {
        operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
      }
      return;
    }
    pcVar4 = 
    "\n      if (this_._internal_$name$_size() > 0) {\n        target = stream->WriteFixedPacked($number$, this_._internal_$name$(), target);\n      }\n    "
    ;
    uVar3 = 0x93;
  }
  else {
    pcVar4 = 
    "\n      for (int i = 0, n = this_._internal_$name$_size(); i < n; ++i) {\n        target = stream->EnsureSpace(target);\n        target = ::_pbi::WireFormatLite::Write$DeclaredType$ToArray(\n            $number$, this_._internal_$name$().Get(i), target);\n      }\n    "
    ;
    uVar3 = 0x107;
  }
  io::Printer::Emit(local_108,0,0,uVar3,pcVar4);
  return;
}

Assistant:

void RepeatedPrimitive::GenerateSerializeWithCachedSizesToArray(
    io::Printer* p) const {
  if (!field_->is_packed()) {
    p->Emit(R"cc(
      for (int i = 0, n = this_._internal_$name$_size(); i < n; ++i) {
        target = stream->EnsureSpace(target);
        target = ::_pbi::WireFormatLite::Write$DeclaredType$ToArray(
            $number$, this_._internal_$name$().Get(i), target);
      }
    )cc");
    return;
  }

  if (FixedSize(field_->type()).has_value()) {
    p->Emit(R"cc(
      if (this_._internal_$name$_size() > 0) {
        target = stream->WriteFixedPacked($number$, this_._internal_$name$(), target);
      }
    )cc");
    return;
  }

  p->Emit(
      {
          {"byte_size",
           [&] {
             if (HasCachedSize()) {
               p->Emit(R"cc(this_.$_field_cached_byte_size_$.Get();)cc");
             } else {
               p->Emit(R"cc(
                 ::_pbi::WireFormatLite::$DeclaredType$Size(
                     this_._internal_$name$());
               )cc");
             }
           }},
      },
      R"cc(
        {
          int byte_size = $byte_size$;
          if (byte_size > 0) {
            target = stream->Write$DeclaredType$Packed(
                $number$, this_._internal_$name$(), byte_size, target);
          }
        }
      )cc");
}